

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O1

CURLcode curl_easy_send(CURL *d,void *buffer,size_t buflen,size_t *n)

{
  _Bool _Var1;
  CURLcode CVar2;
  size_t written;
  size_t local_30;
  
  local_30 = 0;
  _Var1 = Curl_is_in_callback((Curl_easy *)d);
  CVar2 = CURLE_RECURSIVE_API_CALL;
  if (!_Var1) {
    CVar2 = Curl_senddata((Curl_easy *)d,buffer,buflen,&local_30);
    *n = local_30;
  }
  return CVar2;
}

Assistant:

CURLcode curl_easy_send(CURL *d, const void *buffer, size_t buflen, size_t *n)
{
  size_t written = 0;
  CURLcode result;
  struct Curl_easy *data = d;
  if(Curl_is_in_callback(data))
    return CURLE_RECURSIVE_API_CALL;

  result = Curl_senddata(data, buffer, buflen, &written);
  *n = written;
  return result;
}